

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppLog::Clear(ExampleAppLog *this)

{
  int *in_RDI;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1833f7);
  ImVector<int>::clear
            ((ImVector<int> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImVector<int>::push_back((ImVector<int> *)(ulong)in_stack_fffffffffffffff0,in_RDI);
  return;
}

Assistant:

void    Clear()
    {
        Buf.clear();
        LineOffsets.clear();
        LineOffsets.push_back(0);
    }